

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  int *piVar4;
  void *pvVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined8 uVar19;
  undefined4 uVar26;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined8 uVar34;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  bool bVar45;
  pointer pMVar46;
  int iVar47;
  long lVar48;
  uint uVar49;
  Allocator *pAVar50;
  int iVar51;
  int iVar52;
  Allocator *pAVar53;
  long lVar54;
  bool bVar55;
  bool bVar56;
  Mat local_188;
  pointer local_138;
  int _outw;
  int _woffset;
  Mat m;
  int _outh;
  int _outc;
  int _outd;
  int _hoffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c8;
  int local_c0;
  int _coffset;
  Crop_x86 *local_b8;
  Option *local_b0;
  long local_a8;
  int local_a0;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Allocator *local_78;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined3 uVar22;
  undefined1 uVar23;
  undefined2 uVar24;
  undefined1 uVar25;
  undefined4 uVar28;
  undefined3 uVar30;
  undefined2 uVar32;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined3 uVar37;
  undefined1 uVar38;
  undefined2 uVar39;
  undefined1 uVar40;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = pMVar3->elempack;
  local_a8 = (long)pMVar3[1].elempack;
  if (iVar1 != 4) goto LAB_001c03b3;
  local_b8 = (Crop_x86 *)CONCAT44(local_b8._4_4_,pMVar3->w);
  local_c0 = pMVar3->h;
  iVar2 = pMVar3->d;
  local_a0 = pMVar3->c;
  local_b0 = (Option *)CONCAT44(local_b0._4_4_,pMVar3->dims);
  local_c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pMVar3->elemsize;
  local_138 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) != -0xe9) {
    switch(pMVar3->dims) {
    case 1:
      local_188.cstep = (long)pMVar3->elempack * (long)pMVar3->w;
      local_188.elemsize._0_4_ = 4;
      local_188.elempack = 1;
      local_188.dims = 1;
      local_188.w = (int)local_188.cstep;
      local_188.h = 1;
      local_188.d = 1;
      local_188.c = 1;
      break;
    case 2:
      local_188.w = pMVar3->w;
      lVar48 = (long)pMVar3->elempack * (long)pMVar3->h;
      local_188.elemsize._0_4_ = 4;
      local_188.elempack = 1;
      local_188.dims = 2;
      local_188.h = (int)lVar48;
      local_188.d = 1;
      local_188.c = 1;
      local_188.cstep = lVar48 * local_188.w;
      break;
    case 3:
      local_188.w = pMVar3->w;
      local_188.h = pMVar3->h;
      local_188.c = pMVar3->elempack * pMVar3->c;
      local_188.dims = 3;
      local_188.d = 1;
      lVar48 = (long)local_188.h * (long)local_188.w;
      goto LAB_001bef3e;
    case 4:
      local_188.w = pMVar3->w;
      local_188.h = pMVar3->h;
      local_188.d = pMVar3->d;
      local_188.c = pMVar3->elempack * pMVar3->c;
      local_188.dims = 4;
      lVar48 = (long)local_188.h * (long)local_188.w * (long)local_188.d;
LAB_001bef3e:
      local_188.elempack = 1;
      local_188.elemsize._0_4_ = 4;
      local_188.cstep = lVar48 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      local_188.cstep = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
    }
    local_188.elemsize._4_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.refcount._0_4_ = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.data = (void *)0x0;
    switch(pMVar3[1].dims) {
    case 1:
      m.cstep = pMVar3[1].w * local_a8;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      goto LAB_001bf278;
    case 2:
      m.w = pMVar3[1].w;
      lVar48 = pMVar3[1].h * local_a8;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar48;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar48 * m.w;
      break;
    case 3:
      m.w = pMVar3[1].w;
      m.h = pMVar3[1].h;
      iVar52 = pMVar3[1].c;
      m.dims = 3;
      m.d = 1;
      lVar48 = (long)m.h * (long)m.w;
      goto LAB_001bf267;
    case 4:
      m.w = pMVar3[1].w;
      m.h = pMVar3[1].h;
      m.d = pMVar3[1].d;
      iVar52 = pMVar3[1].c;
      m.dims = 4;
      lVar48 = (long)m.h * (long)m.w * (long)m.d;
LAB_001bf267:
      m.c = iVar52 * pMVar3[1].elempack;
      m.cstep = lVar48 + 3U & 0x3ffffffffffffffc;
LAB_001bf278:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    pAVar50 = (Allocator *)&_hoffset;
    Crop::resolve_crop_roi
              (this_00,&local_188,&m,&_woffset,(int *)pAVar50,&_doffset,&_coffset,&_outw,&_outh,
               &_outd,&_outc);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) goto LAB_001bf3eb;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        goto LAB_001bf3eb;
      }
      if (local_188.data == (void *)0x0) goto LAB_001bf3eb;
      goto LAB_001bf3e3;
    }
    goto LAB_001bf3eb;
  }
  switch(pMVar3->dims) {
  case 1:
    local_188.cstep = (long)pMVar3->elempack * (long)pMVar3->w;
    local_188.elemsize._0_4_ = 4;
    local_188.elempack = 1;
    local_188.dims = 1;
    local_188.w = (int)local_188.cstep;
    local_188.h = 1;
    local_188.d = 1;
    local_188.c = 1;
    break;
  case 2:
    local_188.w = pMVar3->w;
    lVar48 = (long)pMVar3->elempack * (long)pMVar3->h;
    local_188.elemsize._0_4_ = 4;
    local_188.elempack = 1;
    local_188.dims = 2;
    local_188.h = (int)lVar48;
    local_188.d = 1;
    local_188.c = 1;
    local_188.cstep = lVar48 * local_188.w;
    break;
  case 3:
    local_188.w = pMVar3->w;
    local_188.h = pMVar3->h;
    local_188.c = pMVar3->elempack * pMVar3->c;
    local_188.dims = 3;
    local_188.d = 1;
    lVar48 = (long)local_188.h * (long)local_188.w;
    goto LAB_001beec7;
  case 4:
    local_188.w = pMVar3->w;
    local_188.h = pMVar3->h;
    local_188.d = pMVar3->d;
    local_188.c = pMVar3->elempack * pMVar3->c;
    local_188.dims = 4;
    lVar48 = (long)local_188.h * (long)local_188.w * (long)local_188.d;
LAB_001beec7:
    local_188.elempack = 1;
    local_188.elemsize._0_4_ = 4;
    local_188.cstep = lVar48 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    local_188.cstep = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elempack = 0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
  }
  local_188.elemsize._4_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.refcount._0_4_ = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.data = (void *)0x0;
  pAVar50 = (Allocator *)&_hoffset;
  Crop::resolve_crop_roi
            (this_00,&local_188,(int *)pMVar3[1].data,&_woffset,(int *)pAVar50,&_doffset,&_coffset,
             &_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
LAB_001bf3e3:
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001bf3eb:
  pMVar46 = local_138;
  iVar52 = iVar2;
  if ((int)local_b0 == 1) {
    uVar49 = _outw & 3;
    iVar51 = (uint)(uVar49 == 0) * 3 + 1;
    if (_outw / iVar51 == (int)local_b8 && uVar49 == 0) {
      if (local_138 != pMVar3) {
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = local_138->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = local_138->data;
            pAVar53 = local_138->allocator;
            if (pAVar53 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar53->_vptr_Allocator[3])(pAVar53,pvVar5,(long)_outw % (long)iVar51 & 0xffffffff)
              ;
            }
          }
        }
        pMVar46->cstep = 0;
        pMVar46->data = (void *)0x0;
        pMVar46->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
        pMVar46->dims = 0;
        pMVar46->w = 0;
        pMVar46->h = 0;
        pMVar46->d = 0;
        pMVar46->c = 0;
        piVar4 = pMVar3->refcount;
        pMVar46->data = pMVar3->data;
        pMVar46->refcount = piVar4;
        pMVar46->elemsize = pMVar3->elemsize;
        pMVar46->elempack = pMVar3->elempack;
        pMVar46->allocator = pMVar3->allocator;
        iVar52 = pMVar3->w;
        iVar51 = pMVar3->h;
        iVar47 = pMVar3->d;
        pMVar46->dims = pMVar3->dims;
        pMVar46->w = iVar52;
        pMVar46->h = iVar51;
        pMVar46->d = iVar47;
        pMVar46->c = pMVar3->c;
        pMVar46->cstep = pMVar3->cstep;
      }
LAB_001bf54e:
      bVar55 = false;
      iVar52 = 0;
    }
    else if (((_outw | _woffset) & 3U) == 0) {
      pAVar50 = opt->blob_allocator;
      Mat::create(local_138,_outw / iVar51,((ulong)local_c8 >> 2) << (uVar49 == 0) * '\x02',iVar51,
                  pAVar50);
      iVar52 = -100;
      if (pMVar46->data == (void *)0x0) {
        bVar55 = false;
      }
      else {
        bVar55 = false;
        if ((long)pMVar46->c * pMVar46->cstep != 0) {
          iVar52 = _woffset + 3;
          if (-1 < _woffset) {
            iVar52 = _woffset;
          }
          crop_pack4_sse(pMVar3,pMVar46,0,iVar52 >> 2);
          goto LAB_001bf54e;
        }
      }
    }
    else {
      bVar55 = true;
    }
    if (bVar55) goto LAB_001bf560;
LAB_001c039c:
    bVar55 = false;
  }
  else {
LAB_001bf560:
    pMVar46 = local_138;
    iVar51 = (int)local_b0;
    if ((int)local_b0 == 2) {
      bVar55 = (_outh & 3U) == 0;
      iVar51 = (uint)bVar55 * 3 + 1;
      pAVar50 = (Allocator *)0x0;
      if (_outw == (int)local_b8) {
        if (((_outh & 3U) != 0) || (_outh / iVar51 != local_c0)) goto LAB_001bf603;
        if (local_138 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_138->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = local_138->data;
              pAVar53 = local_138->allocator;
              if (pAVar53 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar53->_vptr_Allocator[3])
                          (pAVar53,pvVar5,(long)_outh % (long)iVar51 & 0xffffffff);
              }
            }
          }
          pMVar46->cstep = 0;
          pMVar46->data = (void *)0x0;
          pMVar46->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
          pMVar46->dims = 0;
          pMVar46->w = 0;
          pMVar46->h = 0;
          pMVar46->d = 0;
          pMVar46->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar46->data = pMVar3->data;
          pMVar46->refcount = piVar4;
          pMVar46->elemsize = pMVar3->elemsize;
          pMVar46->elempack = pMVar3->elempack;
          pMVar46->allocator = pMVar3->allocator;
          iVar52 = pMVar3->w;
          iVar51 = pMVar3->h;
          iVar47 = pMVar3->d;
          pMVar46->dims = pMVar3->dims;
          pMVar46->w = iVar52;
          pMVar46->h = iVar51;
          pMVar46->d = iVar47;
          pMVar46->c = pMVar3->c;
          pMVar46->cstep = pMVar3->cstep;
        }
LAB_001bf6de:
        bVar56 = false;
        iVar52 = 0;
      }
      else {
LAB_001bf603:
        bVar56 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(local_138,_outw,_outh / iVar51,((ulong)local_c8 >> 2) << bVar55 * '\x02',
                      iVar51,opt->blob_allocator);
          iVar52 = -100;
          if (pMVar46->data == (void *)0x0) {
            bVar56 = false;
          }
          else {
            bVar56 = false;
            if ((long)pMVar46->c * pMVar46->cstep != 0) {
              iVar52 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar52 = _hoffset;
              }
              crop_pack4_sse(pMVar3,pMVar46,iVar52 >> 2,_woffset);
              goto LAB_001bf6de;
            }
          }
        }
      }
      if (!bVar56) goto LAB_001c039c;
      iVar51 = (int)local_b0;
    }
    pMVar46 = local_138;
    if (iVar51 == 3) {
      bVar55 = (_outc & 3U) == 0;
      iVar51 = (uint)bVar55 * 3 + 1;
      pAVar53 = (Allocator *)(((ulong)local_c8 >> 2) << bVar55 * '\x02');
      bVar55 = _outh == local_c0;
      bVar56 = _outw == (int)local_b8;
      pAVar50 = (Allocator *)CONCAT71((int7)((ulong)pAVar50 >> 8),bVar55 && bVar56);
      if (bVar55 && bVar56) {
        if (((_outc & 3U) != 0) || (_outc / iVar51 != local_a0)) goto LAB_001bf7a4;
        if (local_138 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_138->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = local_138->data;
              pAVar53 = local_138->allocator;
              if (pAVar53 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar53->_vptr_Allocator[3])
                          (pAVar53,pvVar5,(long)_outc % (long)iVar51 & 0xffffffff);
              }
            }
          }
          pMVar46->cstep = 0;
          pMVar46->data = (void *)0x0;
          pMVar46->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
          pMVar46->dims = 0;
          pMVar46->w = 0;
          pMVar46->h = 0;
          pMVar46->d = 0;
          pMVar46->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar46->data = pMVar3->data;
          pMVar46->refcount = piVar4;
          pMVar46->elemsize = pMVar3->elemsize;
          pMVar46->elempack = pMVar3->elempack;
          pMVar46->allocator = pMVar3->allocator;
          iVar52 = pMVar3->w;
          iVar51 = pMVar3->h;
          iVar47 = pMVar3->d;
          pMVar46->dims = pMVar3->dims;
          pMVar46->w = iVar52;
          pMVar46->h = iVar51;
          pMVar46->d = iVar47;
          pMVar46->c = pMVar3->c;
          pMVar46->cstep = pMVar3->cstep;
        }
        bVar45 = false;
        iVar52 = 0;
      }
      else {
LAB_001bf7a4:
        bVar45 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          local_188.c = _outc / iVar51;
          local_188.w = pMVar3->w;
          local_188.h = pMVar3->h;
          if (pMVar3->dims == 3) {
            local_188.cstep = pMVar3->elemsize;
            local_188.data =
                 (void *)((long)(_coffset / iVar51) * pMVar3->cstep * local_188.cstep +
                         (long)pMVar3->data);
            local_188.elempack = pMVar3->elempack;
            local_188.allocator = pMVar3->allocator;
            local_188.elemsize._0_4_ = (undefined4)local_188.cstep;
            local_188.elemsize._4_4_ = (undefined4)(local_188.cstep >> 0x20);
            local_188.dims = 3;
            local_188.d = 1;
            lVar48 = (long)local_188.h * (long)local_188.w * local_188.cstep;
          }
          else {
            local_188.cstep = pMVar3->elemsize;
            local_188.data =
                 (void *)((long)(_coffset / iVar51) * pMVar3->cstep * local_188.cstep +
                         (long)pMVar3->data);
            local_188.d = pMVar3->d;
            local_188.elempack = pMVar3->elempack;
            local_188.allocator = pMVar3->allocator;
            local_188.elemsize._0_4_ = (undefined4)local_188.cstep;
            local_188.elemsize._4_4_ = (undefined4)(local_188.cstep >> 0x20);
            local_188.dims = 4;
            lVar48 = (long)local_188.h * (long)local_188.w * (long)local_188.d * local_188.cstep;
          }
          local_188.refcount._4_4_ = 0;
          local_188.refcount._0_4_ = 0;
          local_188.cstep = (lVar48 + 0xfU & 0xfffffffffffffff0) / local_188.cstep;
          if (bVar55 && bVar56) {
            Mat::clone(&m,(__fn *)&local_188,(void *)0x0,local_188.c,pAVar50);
            pMVar46 = local_138;
            if (local_138 != &m) {
              piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = local_138->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_138->allocator == (Allocator *)0x0) {
                    if (local_138->data != (void *)0x0) {
                      free(local_138->data);
                    }
                  }
                  else {
                    (*local_138->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar46->cstep = 0;
              pMVar46->data = (void *)0x0;
              pMVar46->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
              pMVar46->dims = 0;
              pMVar46->w = 0;
              pMVar46->h = 0;
              pMVar46->d = 0;
              pMVar46->c = 0;
              pMVar46->data = m.data;
              pMVar46->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              pMVar46->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              pMVar46->elempack = m.elempack;
              pMVar46->allocator = m.allocator;
              pMVar46->dims = m.dims;
              pMVar46->w = m.w;
              pMVar46->h = m.h;
              pMVar46->d = m.d;
              pMVar46->c = m.c;
              pMVar46->cstep = m.cstep;
            }
            piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  if (m.data != (void *)0x0) {
                    free(m.data);
                  }
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar52 = -100;
            if ((local_138->data != (void *)0x0) && ((long)local_138->c * local_138->cstep != 0))
            goto LAB_001bfa5b;
          }
          else {
LAB_001bfa5b:
            pMVar46 = local_138;
            Mat::create(local_138,_outw,_outh,_outc / iVar51,(size_t)pAVar53,iVar51,
                        opt->blob_allocator);
            iVar52 = -100;
            pAVar50 = pAVar53;
            if ((pMVar46->data != (void *)0x0) && ((long)pMVar46->c * pMVar46->cstep != 0)) {
              if (0 < local_138->c) {
                lVar48 = 0;
                do {
                  if (local_188.dims == 3) {
                    lVar54 = local_188.cstep * lVar48 *
                             CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
                    m.dims = 2;
                    m.c = 1;
                  }
                  else {
                    lVar54 = local_188.cstep * lVar48 *
                             CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
                    m.dims = 3;
                    m.c = local_188.d;
                  }
                  m.data = (void *)(lVar54 + (long)local_188.data);
                  m.d = 1;
                  m.allocator = local_188.allocator;
                  m.elempack = local_188.elempack;
                  m.elemsize._4_4_ = local_188.elemsize._4_4_;
                  m.elemsize._0_4_ = (undefined4)local_188.elemsize;
                  m.refcount._4_4_ = 0;
                  m.refcount._0_4_ = 0;
                  m.h = local_188.h;
                  m.w = local_188.w;
                  m.cstep = (long)local_188.h * (long)local_188.w;
                  if (local_138->dims == 3) {
                    sVar6 = local_138->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_138->cstep * lVar48 * sVar6 + (long)local_138->data);
                    pAVar53 = local_138->allocator;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar6;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                         (undefined4)(sVar6 >> 0x20);
                    local_78 = pAVar53;
                  }
                  else {
                    sVar6 = local_138->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_138->cstep * lVar48 * sVar6 + (long)local_138->data);
                    pAVar53 = (Allocator *)(ulong)(uint)local_138->elempack;
                    local_78 = local_138->allocator;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar6;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                         (undefined4)(sVar6 >> 0x20);
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  crop_pack4_sse(&m,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                  piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_78 == (Allocator *)0x0) {
                        if (bottom_blobs_unpacked.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*local_78->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m.cstep = 0;
                  m.data = (void *)0x0;
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = 0;
                  m.elemsize._4_4_ = 0;
                  m.elempack = 0;
                  m.dims = 0;
                  m.w = 0;
                  m.h = 0;
                  m.d = 0;
                  m.c = 0;
                  lVar48 = lVar48 + 1;
                } while (lVar48 < local_138->c);
              }
              iVar52 = 0;
              pAVar50 = pAVar53;
            }
          }
          piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                if (local_188.data != (void *)0x0) {
                  free(local_188.data);
                }
              }
              else {
                (*(local_188.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar45 = false;
        }
      }
      if (!bVar45) goto LAB_001c039c;
      iVar51 = (int)local_b0;
    }
    pMVar46 = local_138;
    bVar55 = true;
    if (iVar51 == 4) {
      bVar56 = (_outc & 3U) == 0;
      iVar51 = (uint)bVar56 * 3 + 1;
      local_c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                 (((ulong)local_c8 >> 2) << bVar56 * '\x02');
      bVar56 = iVar2 == _outd;
      bVar45 = local_c0 == _outh && (int)local_b8 == _outw;
      if (bVar56 && bVar45) {
        if (((_outc & 3U) == 0) && (_outc / iVar51 == local_a0)) {
          if (local_138 != pMVar3) {
            piVar4 = pMVar3->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = local_138->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pvVar5 = local_138->data;
                pAVar50 = local_138->allocator;
                if (pAVar50 == (Allocator *)0x0) {
                  if (pvVar5 != (void *)0x0) {
                    free(pvVar5);
                  }
                }
                else {
                  (*pAVar50->_vptr_Allocator[3])
                            (pAVar50,pvVar5,(long)_outc % (long)iVar51 & 0xffffffff);
                }
              }
            }
            pMVar46->cstep = 0;
            pMVar46->data = (void *)0x0;
            pMVar46->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
            pMVar46->dims = 0;
            pMVar46->w = 0;
            pMVar46->h = 0;
            pMVar46->d = 0;
            pMVar46->c = 0;
            piVar4 = pMVar3->refcount;
            pMVar46->data = pMVar3->data;
            pMVar46->refcount = piVar4;
            pMVar46->elemsize = pMVar3->elemsize;
            pMVar46->elempack = pMVar3->elempack;
            pMVar46->allocator = pMVar3->allocator;
            iVar2 = pMVar3->w;
            iVar52 = pMVar3->h;
            iVar51 = pMVar3->d;
            pMVar46->dims = pMVar3->dims;
            pMVar46->w = iVar2;
            pMVar46->h = iVar52;
            pMVar46->d = iVar51;
            pMVar46->c = pMVar3->c;
            pMVar46->cstep = pMVar3->cstep;
          }
          bVar55 = false;
          iVar52 = 0;
          goto LAB_001c039e;
        }
      }
      if (((_coffset | _outc) & 3U) == 0) {
        local_188.c = _outc / iVar51;
        local_188.w = pMVar3->w;
        local_188.h = pMVar3->h;
        if (pMVar3->dims == 3) {
          local_188.cstep = pMVar3->elemsize;
          local_188.data =
               (void *)((long)(_coffset / iVar51) * pMVar3->cstep * local_188.cstep +
                       (long)pMVar3->data);
          local_188.elempack = pMVar3->elempack;
          local_188.allocator = pMVar3->allocator;
          local_188.elemsize._0_4_ = (undefined4)local_188.cstep;
          local_188.elemsize._4_4_ = (undefined4)(local_188.cstep >> 0x20);
          local_188.dims = 3;
          local_188.d = 1;
          lVar48 = (long)local_188.h * (long)local_188.w * local_188.cstep;
        }
        else {
          local_188.cstep = pMVar3->elemsize;
          local_188.data =
               (void *)((long)(_coffset / iVar51) * pMVar3->cstep * local_188.cstep +
                       (long)pMVar3->data);
          local_188.d = pMVar3->d;
          local_188.elempack = pMVar3->elempack;
          local_188.allocator = pMVar3->allocator;
          local_188.elemsize._0_4_ = (undefined4)local_188.cstep;
          local_188.elemsize._4_4_ = (undefined4)(local_188.cstep >> 0x20);
          local_188.dims = 4;
          lVar48 = (long)local_188.h * (long)local_188.w * (long)local_188.d * local_188.cstep;
        }
        local_188.refcount._4_4_ = 0;
        local_188.refcount._0_4_ = 0;
        local_188.cstep = (lVar48 + 0xfU & 0xfffffffffffffff0) / local_188.cstep;
        if (bVar56 && (local_c0 == _outh && (int)local_b8 == _outw)) {
          Mat::clone(&m,(__fn *)&local_188,(void *)0x0,local_188.c,
                     (void *)CONCAT71((int7)((ulong)pAVar50 >> 8),bVar56 && bVar45));
          pMVar46 = local_138;
          Mat::operator=(local_138,&m);
          Mat::~Mat(&m);
          iVar52 = -100;
          if ((pMVar46->data != (void *)0x0) && ((long)pMVar46->c * pMVar46->cstep != 0))
          goto LAB_001c0067;
        }
        else {
LAB_001c0067:
          pMVar46 = local_138;
          Mat::create(local_138,_outw,_outh,_outd,_outc / iVar51,(size_t)local_c8,iVar51,
                      opt->blob_allocator);
          iVar52 = -100;
          if ((pMVar46->data != (void *)0x0) && ((long)pMVar46->c * pMVar46->cstep != 0)) {
            if (local_138->c < 1) {
              iVar52 = 0;
            }
            else {
              lVar48 = 0;
              local_c8 = top_blobs;
              local_b8 = this;
              local_b0 = opt;
              do {
                if (0 < _outd) {
                  lVar54 = 0;
                  do {
                    m.cstep = (long)local_188.h * (long)local_188.w;
                    m.data = (void *)((long)local_188.data +
                                     (long)(_doffset + (int)lVar54) *
                                     CONCAT44(local_188.elemsize._4_4_,
                                              (undefined4)local_188.elemsize) * m.cstep +
                                     local_188.cstep * lVar48 *
                                     CONCAT44(local_188.elemsize._4_4_,
                                              (undefined4)local_188.elemsize));
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)local_188.elemsize;
                    m.elemsize._4_4_ = local_188.elemsize._4_4_;
                    m.elempack = local_188.elempack;
                    m.allocator = local_188.allocator;
                    m.dims = 2;
                    m.w = local_188.w;
                    m.h = local_188.h;
                    m.d = 1;
                    m.c = 1;
                    sVar6 = local_138->elemsize;
                    pAVar50 = local_138->allocator;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)local_138->data +
                                  lVar54 * sVar6 * (long)local_138->h * (long)local_138->w +
                                  local_138->cstep * lVar48 * sVar6);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar6;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                         (undefined4)(sVar6 >> 0x20);
                    crop_pack4_sse(&m,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                             bottom_blobs_unpacked.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (pAVar50 == (Allocator *)0x0) {
                          if (bottom_blobs_unpacked.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                          }
                        }
                        else {
                          (*pAVar50->_vptr_Allocator[3])();
                        }
                      }
                    }
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    lVar54 = lVar54 + 1;
                  } while (lVar54 < _outd);
                }
                lVar48 = lVar48 + 1;
              } while (lVar48 < local_138->c);
              iVar52 = 0;
              this = local_b8;
              top_blobs = local_c8;
              opt = local_b0;
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_001c039c;
      }
    }
  }
LAB_001c039e:
  if (bVar55) {
LAB_001c03b3:
    local_188.data = pMVar3->data;
    piVar4 = pMVar3->refcount;
    local_188.refcount._0_4_ = SUB84(piVar4,0);
    local_188.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
    local_188.elemsize._0_4_ = (undefined4)pMVar3->elemsize;
    local_188.elemsize._4_4_ = (undefined4)(pMVar3->elemsize >> 0x20);
    local_188.elempack = pMVar3->elempack;
    local_188.allocator = pMVar3->allocator;
    uVar7 = pMVar3->dims;
    uVar8 = pMVar3->w;
    uVar9 = pMVar3->h;
    uVar10 = pMVar3->d;
    local_188.c = pMVar3->c;
    local_188.cstep = pMVar3->cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_188.dims = uVar7;
    local_188.w = uVar8;
    local_188.h = uVar9;
    local_188.d = uVar10;
    if (iVar1 != 1) {
      m.data = *(void **)opt;
      uVar11 = opt->openmp_blocktime;
      uVar12 = opt->use_winograd_convolution;
      uVar14 = opt->use_sgemm_convolution;
      uVar16 = opt->use_int8_inference;
      uVar18 = opt->use_vulkan_compute;
      uVar17 = CONCAT11(uVar18,uVar16);
      uVar15 = CONCAT21(uVar17,uVar14);
      uVar13 = CONCAT31(uVar15,uVar12);
      m.allocator = *(Allocator **)&opt->use_bf16_storage;
      uVar19._0_1_ = opt->use_shader_pack8;
      uVar19._1_1_ = opt->use_subgroup_basic;
      uVar19._2_1_ = opt->use_subgroup_vote;
      uVar19._3_1_ = opt->use_subgroup_ballot;
      uVar20 = opt->use_subgroup_shuffle;
      uVar21 = opt->use_image_storage;
      uVar23 = opt->use_tensor_storage;
      uVar25 = opt->use_weight_fp16_storage;
      uVar24 = CONCAT11(uVar25,uVar23);
      uVar22 = CONCAT21(uVar24,uVar21);
      uVar19._4_4_ = CONCAT31(uVar22,uVar20);
      uVar26 = opt->flush_denormals;
      uVar27 = opt->use_local_pool_allocator;
      uVar29 = opt->use_reserved_1;
      uVar31 = opt->use_reserved_2;
      uVar33 = opt->use_reserved_3;
      uVar32 = CONCAT11(uVar33,uVar31);
      uVar30 = CONCAT21(uVar32,uVar29);
      uVar28 = CONCAT31(uVar30,uVar27);
      uVar34._0_1_ = opt->use_reserved_4;
      uVar34._1_1_ = opt->use_reserved_5;
      uVar34._2_1_ = opt->use_reserved_6;
      uVar34._3_1_ = opt->use_reserved_7;
      uVar35 = opt->use_reserved_8;
      uVar36 = opt->use_reserved_9;
      uVar38 = opt->use_reserved_10;
      uVar40 = opt->use_reserved_11;
      uVar39 = CONCAT11(uVar40,uVar38);
      uVar37 = CONCAT21(uVar39,uVar36);
      uVar34._4_4_ = CONCAT31(uVar37,uVar35);
      m.c = (int)uVar34;
      m.dims = (int)uVar19;
      m.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m.elempack = uVar11;
      m._28_4_ = uVar13;
      m.w = uVar19._4_4_;
      m.h = uVar26;
      m.d = uVar28;
      m._60_4_ = uVar34._4_4_;
      convert_packing(pMVar3,&local_188,1,(Option *)&m);
    }
    m.data = pMVar3[1].data;
    piVar4 = pMVar3[1].refcount;
    m.refcount._0_4_ = SUB84(piVar4,0);
    m.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
    m.elemsize._0_4_ = (undefined4)pMVar3[1].elemsize;
    m.elemsize._4_4_ = (undefined4)(pMVar3[1].elemsize >> 0x20);
    m.elempack = pMVar3[1].elempack;
    m.allocator = pMVar3[1].allocator;
    uVar41 = pMVar3[1].dims;
    uVar42 = pMVar3[1].w;
    uVar43 = pMVar3[1].h;
    uVar44 = pMVar3[1].d;
    m.c = pMVar3[1].c;
    m.cstep = pMVar3[1].cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    m.dims = uVar41;
    m.w = uVar42;
    m.h = uVar43;
    m.d = uVar44;
    if ((int)local_a8 != 1) {
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)opt;
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(opt->workspace_allocator,0);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(opt->workspace_allocator,0);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      convert_packing(pMVar3 + 1,&m,1,(Option *)&bottom_blobs_unpacked);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs_unpacked,2,(allocator_type *)&_woffset);
    pMVar46 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &local_188) {
      piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start)->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar46->cstep = 0;
      pMVar46->data = (void *)0x0;
      pMVar46->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar46->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar46->elemsize + 4) = 0;
      pMVar46->dims = 0;
      pMVar46->w = 0;
      pMVar46->h = 0;
      pMVar46->d = 0;
      pMVar46->c = 0;
      pMVar46->data = local_188.data;
      pMVar46->refcount = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      pMVar46->elemsize = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      pMVar46->elempack = local_188.elempack;
      pMVar46->allocator = local_188.allocator;
      pMVar46->dims = local_188.dims;
      pMVar46->w = local_188.w;
      pMVar46->h = local_188.h;
      pMVar46->d = local_188.d;
      pMVar46->c = local_188.c;
      pMVar46->cstep = local_188.cstep;
    }
    pMVar46 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar3 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start + 1;
    if (pMVar3 != &m) {
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start[1].refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
              free(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].data);
            }
          }
          else {
            (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar46[1].cstep = 0;
      *(undefined8 *)((long)&pMVar46[1].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar46[1].elemsize + 4) = 0;
      pMVar3->data = (void *)0x0;
      pMVar46[1].refcount = (int *)0x0;
      pMVar46[1].dims = 0;
      pMVar46[1].w = 0;
      pMVar46[1].h = 0;
      pMVar46[1].d = 0;
      pMVar46[1].c = 0;
      pMVar46[1].data = m.data;
      pMVar46[1].refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      pMVar46[1].elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
      pMVar46[1].elempack = m.elempack;
      pMVar46[1].allocator = m.allocator;
      pMVar46[1].dims = m.dims;
      pMVar46[1].w = m.w;
      pMVar46[1].h = m.h;
      pMVar46[1].d = m.d;
      pMVar46[1].c = m.c;
      pMVar46[1].cstep = m.cstep;
    }
    iVar52 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                           &bottom_blobs_unpacked,top_blobs,opt);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    piVar4 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar52;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}